

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O1

void nhdp_db_link_addr_remove(nhdp_laddr *laddr)

{
  oonf_class_event(&_laddr_info,laddr,OONF_OBJECT_REMOVED);
  avl_remove(&laddr->link->local_if->_link_addresses,&laddr->_if_node);
  avl_remove(&laddr->link->_addresses,&laddr->_link_node);
  avl_remove(&laddr->link->neigh->_link_addresses,&laddr->_neigh_node);
  oonf_class_free(&_laddr_info,laddr);
  return;
}

Assistant:

void
nhdp_db_link_addr_remove(struct nhdp_laddr *laddr) {
  /* trigger event */
  oonf_class_event(&_laddr_info, laddr, OONF_OBJECT_REMOVED);

  /* remove from trees */
  nhdp_interface_remove_laddr(laddr);
  avl_remove(&laddr->link->_addresses, &laddr->_link_node);
  avl_remove(&laddr->link->neigh->_link_addresses, &laddr->_neigh_node);

  /* free memory */
  oonf_class_free(&_laddr_info, laddr);
}